

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<bool>::~RepeatedField(RepeatedField<bool> *this)

{
  InternalDeallocate(this,this->rep_,this->total_size_);
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  // See explanation in Reserve(): we need to invoke destructors here for the
  // case that Element has a non-trivial destructor.
  InternalDeallocate(rep_, total_size_);
}